

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

Float pbrt::IntegrateCatmullRom(span<const_float> nodes,span<const_float> f,span<float> cdf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  size_t vb;
  size_t va;
  
  vb = f.n;
  pfVar5 = f.ptr;
  va = nodes.n;
  pfVar6 = nodes.ptr;
  if (va != vb) {
    LogFatal<char_const(&)[13],char_const(&)[9],char_const(&)[13],unsigned_long&,char_const(&)[9],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.cpp"
               ,0x10d,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])"nodes.size()",
               (char (*) [9])0x45ea94,(char (*) [13])"nodes.size()",&va,(char (*) [9])0x45ea94,&vb);
  }
  *cdf.ptr = 0.0;
  if (va == 1) {
    auVar8 = ZEXT816(0) << 0x40;
  }
  else {
    auVar8 = ZEXT816(0) << 0x40;
    lVar4 = 0;
    lVar7 = 0;
    do {
      fVar10 = *(float *)((long)pfVar6 + lVar4 + 4);
      fVar1 = *(float *)((long)pfVar5 + lVar4);
      fVar2 = *(float *)((long)pfVar5 + lVar4 + 4);
      fVar3 = fVar10 - *(float *)((long)pfVar6 + lVar4);
      if (lVar4 == 0) {
        fVar10 = fVar2 - fVar1;
      }
      else {
        fVar10 = ((fVar2 - *(float *)((long)pfVar5 + lVar4 + -4)) * fVar3) /
                 (fVar10 - *(float *)((long)pfVar6 + lVar4 + -4));
      }
      if (lVar7 + 2U < va) {
        fVar9 = ((*(float *)((long)pfVar5 + lVar4 + 8) - fVar1) * fVar3) /
                (*(float *)((long)pfVar6 + lVar4 + 8) - *(float *)((long)pfVar6 + lVar4));
      }
      else {
        fVar9 = fVar2 - fVar1;
      }
      lVar7 = lVar7 + 1;
      auVar8 = vfmadd213ss_fma(ZEXT416((uint)((fVar1 + fVar2) * 0.5 + (fVar10 - fVar9) / 12.0)),
                               ZEXT416((uint)fVar3),auVar8);
      *(int *)((long)cdf.ptr + lVar4 + 4) = auVar8._0_4_;
      lVar4 = lVar4 + 4;
    } while (lVar7 != va - 1);
  }
  return auVar8._0_4_;
}

Assistant:

Float IntegrateCatmullRom(pstd::span<const Float> nodes, pstd::span<const Float> f,
                          pstd::span<Float> cdf) {
    CHECK_EQ(nodes.size(), f.size());
    Float sum = 0;
    cdf[0] = 0;
    for (int i = 0; i < nodes.size() - 1; ++i) {
        // Look up $x_i$ and function values of spline segment _i_
        Float x0 = nodes[i], x1 = nodes[i + 1];
        Float f0 = f[i], f1 = f[i + 1];
        Float width = x1 - x0;

        // Approximate derivatives using finite differences
        Float d0 = (i > 0) ? width * (f1 - f[i - 1]) / (x1 - nodes[i - 1]) : (f1 - f0);
        Float d1 = (i + 2 < nodes.size()) ? width * (f[i + 2] - f0) / (nodes[i + 2] - x0)
                                          : (f1 - f0);

        // Keep a running sum and build a cumulative distribution function
        sum += width * ((f0 + f1) / 2 + (d0 - d1) / 12);
        cdf[i + 1] = sum;
    }
    return sum;
}